

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-file_reading.c
# Opt level: O3

void CGTFS_FileReading(void)

{
  int iVar1;
  uint uVar2;
  FILE *pFVar3;
  long lVar4;
  char *pcVar5;
  calendar_date_t *pcVar6;
  byte bVar7;
  agency_t *records;
  transfer_t *records_11;
  stop_t *local_2170;
  undefined1 local_2168 [112];
  undefined1 local_20f8 [48];
  undefined1 auStack_20c8 [80];
  undefined1 local_2078 [80];
  undefined1 local_2028 [140];
  undefined1 local_1f9c [28];
  undefined1 auStack_1f80 [240];
  undefined1 local_1e90 [216];
  undefined1 local_1db8 [512];
  undefined1 auStack_1bb8 [7048];
  
  bVar7 = 0;
  iVar1 = greatest_test_pre("fr_agency");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/google_sample/agency.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        greatest_info.fail_line = 0xb;
        greatest_info.msg = "Couldn\'t open `data/google_sample/agency.txt` test file";
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
      }
      else {
        iVar1 = read_all_agencies((FILE *)pFVar3,(agency_t **)&local_2170);
        uVar2 = greatest_info.assertions;
        greatest_info.assertions = greatest_info.assertions + 1;
        if (iVar1 == 1) {
          memcpy((agency_t *)local_2168,&DAT_001e9fe0,0x280);
          greatest_info.assertions = uVar2 + 2;
          iVar1 = equal_agency((agency_t *)local_2168,(agency_t *)local_2170);
          if (iVar1 != 0) {
            free(local_2170);
            fclose(pFVar3);
            greatest_info.msg = (char *)0x0;
            iVar1 = 0;
            goto LAB_0011c158;
          }
          greatest_info.fail_line = 0x1b;
          greatest_info.msg = "equal_agency(&(expected[0]), &(records[0]))";
        }
        else {
          greatest_info.fail_line = 0x10;
          greatest_info.msg = "1 != record_count";
        }
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
        iVar1 = -1;
      }
    }
LAB_0011c158:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("fr_calendar_dates");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/google_sample/calendar_dates.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        greatest_info.fail_line = 0x26;
        greatest_info.msg = "Couldn\'t open `data/google_sample/calendar_dates.txt` test file";
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
      }
      else {
        iVar1 = read_all_calendar_dates((FILE *)pFVar3,(calendar_date_t **)&local_2170);
        if (iVar1 == 1) {
          pcVar5 = "FULLW";
          pcVar6 = (calendar_date_t *)local_2168;
          for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
            *(undefined8 *)pcVar6->service_id = *(undefined8 *)pcVar5;
            pcVar5 = pcVar5 + ((ulong)bVar7 * -2 + 1) * 8;
            pcVar6 = (calendar_date_t *)((long)pcVar6 + (ulong)bVar7 * -0x10 + 8);
          }
          greatest_info.assertions = greatest_info.assertions + 2;
          iVar1 = equal_calendar_date((calendar_date_t *)local_2168,(calendar_date_t *)local_2170);
          if (iVar1 != 0) {
            free(local_2170);
            fclose(pFVar3);
            greatest_info.msg = (char *)0x0;
            iVar1 = 0;
            goto LAB_0011c2af;
          }
          greatest_info.fail_line = 0x35;
          greatest_info.msg = "equal_calendar_date(&(expected[0]), &(records[0]))";
        }
        else {
          greatest_info.fail_line = 0x2b;
          greatest_info.msg = "1 != record_count";
          greatest_info.assertions = greatest_info.assertions + 1;
        }
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
        iVar1 = -1;
      }
    }
LAB_0011c2af:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("fr_calendar_records");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/google_sample/calendar.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        greatest_info.fail_line = 0x40;
        greatest_info.msg = "Couldn\'t open `data/google_sample/calendar.txt` test file";
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
      }
      else {
        iVar1 = read_all_calendar_records((FILE *)pFVar3,(calendar_record_t **)&local_2170);
        uVar2 = greatest_info.assertions;
        greatest_info.assertions = greatest_info.assertions + 1;
        if (iVar1 == 2) {
          memcpy((calendar_record_t *)local_2168,"FULLW",0xe0);
          greatest_info.assertions = uVar2 + 2;
          iVar1 = equal_calendar_record
                            ((calendar_record_t *)local_2168,(calendar_record_t *)local_2170);
          if (iVar1 == 0) {
            greatest_info.fail_line = 0x62;
            greatest_info.msg = "equal_calendar_record(&(expected[0]), &(records[0]))";
          }
          else {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar1 = equal_calendar_record
                              ((calendar_record_t *)local_20f8,
                               (calendar_record_t *)(local_2170->code + 0x30));
            if (iVar1 != 0) {
              free(local_2170);
              fclose(pFVar3);
              greatest_info.msg = (char *)0x0;
              iVar1 = 0;
              goto LAB_0011c455;
            }
            greatest_info.fail_line = 99;
            greatest_info.msg = "equal_calendar_record(&(expected[1]), &(records[1]))";
          }
        }
        else {
          greatest_info.fail_line = 0x45;
          greatest_info.msg = "2 != record_count";
        }
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
        iVar1 = -1;
      }
    }
LAB_0011c455:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("fr_fare_attributes");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/google_sample/fare_attributes.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        greatest_info.fail_line = 0x6e;
        greatest_info.msg = "Couldn\'t open `data/google_sample/fare_attributes.txt` test file";
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
      }
      else {
        iVar1 = read_all_fare_attributes((FILE *)pFVar3,(fare_attributes_t **)&local_2170);
        uVar2 = greatest_info.assertions;
        greatest_info.assertions = greatest_info.assertions + 1;
        if (iVar1 == 2) {
          memcpy((fare_attributes_t *)local_2168,&DAT_001ea390,0x140);
          greatest_info.assertions = uVar2 + 2;
          iVar1 = equal_fare_attributes
                            ((fare_attributes_t *)local_2168,(fare_attributes_t *)local_2170);
          if (iVar1 == 0) {
            greatest_info.fail_line = 0x88;
            greatest_info.msg = "equal_fare_attributes(&(expected[0]), &(records[0]))";
          }
          else {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar1 = equal_fare_attributes
                              ((fare_attributes_t *)auStack_20c8,
                               (fare_attributes_t *)(local_2170->name + 0x20));
            if (iVar1 != 0) {
              free(local_2170);
              fclose(pFVar3);
              greatest_info.msg = (char *)0x0;
              iVar1 = 0;
              goto LAB_0011c5fa;
            }
            greatest_info.fail_line = 0x89;
            greatest_info.msg = "equal_fare_attributes(&(expected[1]), &(records[1]))";
          }
        }
        else {
          greatest_info.fail_line = 0x73;
          greatest_info.msg = "2 != record_count";
        }
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
        iVar1 = -1;
      }
    }
LAB_0011c5fa:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("fr_fare_rules");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/google_sample/fare_rules.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        greatest_info.fail_line = 0x94;
        greatest_info.msg = "Couldn\'t open `data/google_sample/fare_rules.txt` test file";
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
      }
      else {
        iVar1 = read_all_fare_rules((FILE *)pFVar3,(fare_rule_t **)&local_2170);
        uVar2 = greatest_info.assertions;
        greatest_info.assertions = greatest_info.assertions + 1;
        if (iVar1 == 4) {
          memcpy((fare_rule_t *)local_2168,&DAT_001ea4d0,0x500);
          greatest_info.assertions = uVar2 + 2;
          iVar1 = equal_fare_rule((fare_rule_t *)local_2168,(fare_rule_t *)local_2170);
          if (iVar1 == 0) {
            greatest_info.fail_line = 0xba;
            greatest_info.msg = "equal_fare_rule(&(expected[0]), &(records[0]))";
          }
          else {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar1 = equal_fare_rule((fare_rule_t *)local_2028,
                                    (fare_rule_t *)(local_2170->desc + 0x80));
            if (iVar1 == 0) {
              greatest_info.fail_line = 0xbb;
              greatest_info.msg = "equal_fare_rule(&(expected[1]), &(records[1]))";
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_fare_rule((fare_rule_t *)(auStack_1f80 + 0x98),
                                      (fare_rule_t *)(local_2170->url + 0x60));
              if (iVar1 == 0) {
                greatest_info.fail_line = 0xbc;
                greatest_info.msg = "equal_fare_rule(&(expected[2]), &(records[2]))";
              }
              else {
                greatest_info.assertions = greatest_info.assertions + 1;
                iVar1 = equal_fare_rule((fare_rule_t *)(local_1db8 + 0x10),
                                        (fare_rule_t *)(local_2170[1].id + 0x10));
                if (iVar1 != 0) {
                  free(local_2170);
                  fclose(pFVar3);
                  greatest_info.msg = (char *)0x0;
                  iVar1 = 0;
                  goto LAB_0011c82a;
                }
                greatest_info.fail_line = 0xbd;
                greatest_info.msg = "equal_fare_rule(&(expected[3]), &(records[3]))";
              }
            }
          }
        }
        else {
          greatest_info.fail_line = 0x99;
          greatest_info.msg = "4 != record_count";
        }
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
        iVar1 = -1;
      }
    }
LAB_0011c82a:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("fr_frequencies");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/google_sample/frequencies.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        greatest_info.fail_line = 200;
        greatest_info.msg = "Couldn\'t open `data/google_sample/frequencies.txt` test file";
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
      }
      else {
        iVar1 = read_all_frequencies((FILE *)pFVar3,(frequency_t **)&local_2170);
        uVar2 = greatest_info.assertions;
        greatest_info.assertions = greatest_info.assertions + 1;
        if (iVar1 == 0xb) {
          memcpy((frequency_t *)local_2168,&DAT_001ea9d0,0x3f4);
          greatest_info.assertions = uVar2 + 2;
          iVar1 = equal_frequency((frequency_t *)local_2168,(frequency_t *)local_2170);
          if (iVar1 == 0) {
            greatest_info.fail_line = 0xe4;
            greatest_info.msg = "equal_frequency(&(expected[0]), &(records[0]))";
          }
          else {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar1 = equal_frequency((frequency_t *)(local_2168 + 0x5c),
                                    (frequency_t *)(local_2170->code + 0x1c));
            if (iVar1 == 0) {
              greatest_info.fail_line = 0xe5;
              greatest_info.msg = "equal_frequency(&(expected[1]), &(records[1]))";
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_frequency((frequency_t *)(auStack_20c8 + 0x18),
                                      (frequency_t *)(local_2170->name + 0x38));
              if (iVar1 != 0) {
                free(local_2170);
                fclose(pFVar3);
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_0011ca15;
              }
              greatest_info.fail_line = 0xe6;
              greatest_info.msg = "equal_frequency(&(expected[2]), &(records[2]))";
            }
          }
        }
        else {
          greatest_info.fail_line = 0xcd;
          greatest_info.msg = "11 != record_count";
        }
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
        iVar1 = -1;
      }
    }
LAB_0011ca15:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("fr_levels");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/ext_levels.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        greatest_info.fail_line = 0xf1;
        greatest_info.msg = "Couldn\'t open `data/ext_levels.txt` test file";
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
      }
      else {
        iVar1 = read_all_levels((FILE *)pFVar3,(level_t **)&local_2170);
        uVar2 = greatest_info.assertions;
        greatest_info.assertions = greatest_info.assertions + 1;
        if (iVar1 == 4) {
          memcpy((level_t *)local_2168,"LVL_001",0x220);
          greatest_info.assertions = uVar2 + 2;
          iVar1 = equal_level((level_t *)local_2168,(level_t *)local_2170);
          if (iVar1 == 0) {
            greatest_info.fail_line = 0x10f;
            greatest_info.msg = "equal_level(&(expected[0]), &(records[0]))";
          }
          else {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar1 = equal_level((level_t *)(local_20f8 + 0x18),(level_t *)(local_2170->name + 8));
            if (iVar1 == 0) {
              greatest_info.fail_line = 0x110;
              greatest_info.msg = "equal_level(&(expected[1]), &(records[1]))";
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_level((level_t *)(local_2078 + 0x20),
                                  (level_t *)(local_2170->desc + 0x50));
              if (iVar1 == 0) {
                greatest_info.fail_line = 0x111;
                greatest_info.msg = "equal_level(&(expected[2]), &(records[2]))";
              }
              else {
                greatest_info.assertions = greatest_info.assertions + 1;
                iVar1 = equal_level((level_t *)(local_2028 + 0x58),
                                    (level_t *)(local_2170->desc + 0xd8));
                if (iVar1 != 0) {
                  free(local_2170);
                  fclose(pFVar3);
                  greatest_info.msg = (char *)0x0;
                  iVar1 = 0;
                  goto LAB_0011cc45;
                }
                greatest_info.fail_line = 0x112;
                greatest_info.msg = "equal_level(&(expected[3]), &(records[3]))";
              }
            }
          }
        }
        else {
          greatest_info.fail_line = 0xf6;
          greatest_info.msg = "4 != record_count";
        }
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
        iVar1 = -1;
      }
    }
LAB_0011cc45:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("fr_pathways");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/ext_pathways.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        greatest_info.fail_line = 0x11d;
        greatest_info.msg = "Couldn\'t open `data/ext_pathways.txt` test file";
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
      }
      else {
        iVar1 = read_all_pathways((FILE *)pFVar3,(pathway_t **)&local_2170);
        uVar2 = greatest_info.assertions;
        greatest_info.assertions = greatest_info.assertions + 1;
        if (iVar1 == 2) {
          memcpy((pathway_t *)local_2168,&DAT_001eaff0,0x3d0);
          greatest_info.assertions = uVar2 + 2;
          iVar1 = equal_pathway((pathway_t *)local_2168,(pathway_t *)local_2170);
          if (iVar1 == 0) {
            greatest_info.fail_line = 0x143;
            greatest_info.msg = "equal_pathway(&(expected[0]), &(records[0]))";
          }
          else {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar1 = equal_pathway((pathway_t *)auStack_1f80,(pathway_t *)(local_2170->zone_id + 8));
            if (iVar1 != 0) {
              free(local_2170);
              fclose(pFVar3);
              greatest_info.msg = (char *)0x0;
              iVar1 = 0;
              goto LAB_0011cdea;
            }
            greatest_info.fail_line = 0x144;
            greatest_info.msg = "equal_pathway(&(expected[1]), &(records[1]))";
          }
        }
        else {
          greatest_info.fail_line = 0x122;
          greatest_info.msg = "2 != record_count";
        }
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
        iVar1 = -1;
      }
    }
LAB_0011cdea:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("fr_routes");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/google_sample/routes.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        greatest_info.fail_line = 0x14f;
        greatest_info.msg = "Couldn\'t open `data/google_sample/routes.txt` test file";
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
      }
      else {
        iVar1 = read_all_routes((FILE *)pFVar3,(route_t **)&local_2170);
        uVar2 = greatest_info.assertions;
        greatest_info.assertions = greatest_info.assertions + 1;
        if (iVar1 == 5) {
          memcpy((route_t *)local_2168,&DAT_001eb3c0,0xe38);
          greatest_info.assertions = uVar2 + 2;
          iVar1 = equal_route((route_t *)local_2168,(route_t *)local_2170);
          if (iVar1 == 0) {
            greatest_info.fail_line = 0x17a;
            greatest_info.msg = "equal_route(&(expected[0]), &(records[0]))";
          }
          else {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar1 = equal_route((route_t *)local_1e90,(route_t *)(local_2170->parent_station + 0x34)
                               );
            if (iVar1 == 0) {
              greatest_info.fail_line = 0x17b;
              greatest_info.msg = "equal_route(&(expected[1]), &(records[1]))";
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_route((route_t *)auStack_1bb8,(route_t *)(local_2170[1].zone_id + 0x20))
              ;
              if (iVar1 != 0) {
                free(local_2170);
                fclose(pFVar3);
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_0011cfd5;
              }
              greatest_info.fail_line = 0x17c;
              greatest_info.msg = "equal_route(&(expected[2]), &(records[2]))";
            }
          }
        }
        else {
          greatest_info.fail_line = 0x154;
          greatest_info.msg = "5 != record_count";
        }
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
        iVar1 = -1;
      }
    }
LAB_0011cfd5:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("fr_shapes");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/google_sample/shapes.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        greatest_info.fail_line = 0x187;
        greatest_info.msg = "Couldn\'t open `data/google_sample/shapes.txt` test file";
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
      }
      else {
        iVar1 = read_all_shapes((FILE *)pFVar3,(shape_t **)local_2168);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (iVar1 == 0) {
          fclose(pFVar3);
          greatest_info.msg = (char *)0x0;
          iVar1 = 0;
        }
        else {
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
          ;
          greatest_info.fail_line = 0x18c;
          greatest_info.msg = "0 != record_count";
          if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
          iVar1 = -1;
        }
      }
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("fr_stop_times");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/google_sample/stop_times.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        greatest_info.fail_line = 0x197;
        greatest_info.msg = "Couldn\'t open `data/google_sample/stop_times.txt` test file";
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
      }
      else {
        iVar1 = read_all_stop_times((FILE *)pFVar3,(stop_time_t **)&local_2170);
        uVar2 = greatest_info.assertions;
        greatest_info.assertions = greatest_info.assertions + 1;
        if (iVar1 == 0x1c) {
          memcpy((stop_time_t *)local_2168,&DAT_001ec200,0x1a40);
          greatest_info.assertions = uVar2 + 2;
          iVar1 = equal_stop_time((stop_time_t *)local_2168,(stop_time_t *)local_2170);
          if (iVar1 == 0) {
            greatest_info.fail_line = 0x1c5;
            greatest_info.msg = "equal_stop_time(&(expected[0]), &(records[0]))";
          }
          else {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar1 = equal_stop_time((stop_time_t *)local_2078,
                                    (stop_time_t *)(local_2170->desc + 0x30));
            if (iVar1 == 0) {
              greatest_info.fail_line = 0x1c6;
              greatest_info.msg = "equal_stop_time(&(expected[1]), &(records[1]))";
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_stop_time((stop_time_t *)(local_1f9c + 0x14),
                                      (stop_time_t *)local_2170->zone_id);
              if (iVar1 != 0) {
                free(local_2170);
                fclose(pFVar3);
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_0011d2b5;
              }
              greatest_info.fail_line = 0x1c7;
              greatest_info.msg = "equal_stop_time(&(expected[2]), &(records[2]))";
            }
          }
        }
        else {
          greatest_info.fail_line = 0x19c;
          greatest_info.msg = "28 != record_count";
        }
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
        iVar1 = -1;
      }
    }
LAB_0011d2b5:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("fr_stops");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/google_sample/stops.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        greatest_info.fail_line = 0x1d2;
        greatest_info.msg = "Couldn\'t open `data/google_sample/stops.txt` test file";
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
      }
      else {
        iVar1 = read_all_stops((FILE *)pFVar3,&local_2170);
        uVar2 = greatest_info.assertions;
        greatest_info.assertions = greatest_info.assertions + 1;
        if (iVar1 == 9) {
          memcpy((stop_t *)local_2168,"FUR_CREEK_RES",0x2130);
          greatest_info.assertions = uVar2 + 2;
          iVar1 = equal_stop((stop_t *)local_2168,local_2170);
          if (iVar1 == 0) {
            greatest_info.fail_line = 0x1fd;
            greatest_info.msg = "equal_stop(&(expected[0]), &(records[0]))";
          }
          else {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar1 = equal_stop((stop_t *)local_1db8,local_2170 + 1);
            if (iVar1 == 0) {
              greatest_info.fail_line = 0x1fe;
              greatest_info.msg = "equal_stop(&(expected[1]), &(records[1]))";
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_stop((stop_t *)(auStack_1bb8 + 0x1b0),local_2170 + 2);
              if (iVar1 != 0) {
                free(local_2170);
                fclose(pFVar3);
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_0011d4a0;
              }
              greatest_info.fail_line = 0x1ff;
              greatest_info.msg = "equal_stop(&(expected[2]), &(records[2]))";
            }
          }
        }
        else {
          greatest_info.fail_line = 0x1d7;
          greatest_info.msg = "9 != record_count";
        }
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
        iVar1 = -1;
      }
    }
LAB_0011d4a0:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("fr_transfers");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/google_sample/transfers.txt","r");
      uVar2 = read_all_transfers((FILE *)pFVar3,(transfer_t **)local_2168);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (uVar2 == 0xffffffff) {
        if (pFVar3 != (FILE *)0x0) {
          fclose(pFVar3);
        }
        greatest_info.msg = (char *)0x0;
        iVar1 = 0;
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",0xffffffff);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)uVar2);
        fputc(10,_stdout);
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        greatest_info.fail_line = 0x20d;
        greatest_info.msg = "Parsed records from empty file";
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
      }
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("fr_trips");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    pFVar3 = fopen("../tests/data/google_sample/trips.txt","r");
    if (pFVar3 == (FILE *)0x0) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
      ;
      greatest_info.fail_line = 0x218;
      greatest_info.msg = "Couldn\'t open `data/google_sample/trips.txt` test file";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_0011d7d1;
    }
    else {
      iVar1 = read_all_trips((FILE *)pFVar3,(trip_t **)&local_2170);
      uVar2 = greatest_info.assertions;
      greatest_info.assertions = greatest_info.assertions + 1;
      if (iVar1 == 0xb) {
        memcpy((trip_t *)local_2168,&DAT_001efd70,0x13c4);
        greatest_info.assertions = uVar2 + 2;
        iVar1 = equal_trip((trip_t *)local_2168,(trip_t *)local_2170);
        if (iVar1 == 0) {
          greatest_info.fail_line = 0x23d;
          greatest_info.msg = "equal_trip(&(expected[0]), &(records[0]))";
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar1 = equal_trip((trip_t *)local_1f9c,(trip_t *)&local_2170->field_0x1cc);
          if (iVar1 == 0) {
            greatest_info.fail_line = 0x23e;
            greatest_info.msg = "equal_trip(&(expected[1]), &(records[1]))";
          }
          else {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar1 = equal_trip((trip_t *)(local_1e90 + 0xc0),
                               (trip_t *)(local_2170->platform_code + 0x30));
            if (iVar1 != 0) {
              free(local_2170);
              fclose(pFVar3);
              greatest_info.msg = (char *)0x0;
              iVar1 = 0;
              goto LAB_0011d7ba;
            }
            greatest_info.fail_line = 0x23f;
            greatest_info.msg = "equal_trip(&(expected[2]), &(records[2]))";
          }
        }
      }
      else {
        greatest_info.fail_line = 0x21d;
        greatest_info.msg = "11 != record_count";
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
      ;
      if ((greatest_info.flags & 4) != 0) {
LAB_0011d7d1:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        abort();
      }
      iVar1 = -1;
    }
  }
LAB_0011d7ba:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_FileReading) {
    RUN_TEST(fr_agency);
    RUN_TEST(fr_calendar_dates);
    RUN_TEST(fr_calendar_records);
    RUN_TEST(fr_fare_attributes);
    RUN_TEST(fr_fare_rules);
    RUN_TEST(fr_frequencies);
    RUN_TEST(fr_levels);
    RUN_TEST(fr_pathways);
    RUN_TEST(fr_routes);
    RUN_TEST(fr_shapes);
    RUN_TEST(fr_stop_times);
    RUN_TEST(fr_stops);
    RUN_TEST(fr_transfers);
    RUN_TEST(fr_trips);
}